

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O0

void av1_cdef_frame(YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,MACROBLOCKD *xd,
                   cdef_init_fb_row_t cdef_init_fb_row_fn)

{
  int iVar1;
  AV1_COMMON *in_RSI;
  undefined8 in_RDI;
  int plane_start;
  int unaff_retaddr;
  int unaff_retaddr_00;
  YV12_BUFFER_CONFIG *in_stack_00000008;
  BLOCK_SIZE in_stack_00000017;
  macroblockd_plane *in_stack_00000018;
  int fbr;
  int nvfb;
  int num_planes;
  int in_stack_00000a5c;
  uint16_t *in_stack_00000a60;
  uint16_t **in_stack_00000a68;
  uint16_t **in_stack_00000a70;
  MACROBLOCKD *in_stack_00000a78;
  AV1_COMMON *in_stack_00000a80;
  cdef_init_fb_row_t in_stack_00000a90;
  AV1CdefSyncData *in_stack_00000a98;
  aom_internal_error_info *in_stack_00000aa0;
  int local_2c;
  
  plane_start = (int)((ulong)in_RDI >> 0x20);
  av1_num_planes(in_RSI);
  iVar1 = (in_RSI->mi_params).mi_rows;
  av1_setup_dst_planes
            (in_stack_00000018,in_stack_00000017,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
             plane_start,(int)frame);
  for (local_2c = 0; local_2c < (iVar1 + 0xf) / 0x10; local_2c = local_2c + 1) {
    av1_cdef_fb_row(in_stack_00000a80,in_stack_00000a78,in_stack_00000a70,in_stack_00000a68,
                    in_stack_00000a60,in_stack_00000a5c,in_stack_00000a90,in_stack_00000a98,
                    in_stack_00000aa0);
  }
  return;
}

Assistant:

void av1_cdef_frame(YV12_BUFFER_CONFIG *frame, AV1_COMMON *const cm,
                    MACROBLOCKD *xd, cdef_init_fb_row_t cdef_init_fb_row_fn) {
  const int num_planes = av1_num_planes(cm);
  const int nvfb = (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;

  av1_setup_dst_planes(xd->plane, cm->seq_params->sb_size, frame, 0, 0, 0,
                       num_planes);

  for (int fbr = 0; fbr < nvfb; fbr++)
    av1_cdef_fb_row(cm, xd, cm->cdef_info.linebuf, cm->cdef_info.colbuf,
                    cm->cdef_info.srcbuf, fbr, cdef_init_fb_row_fn, NULL,
                    xd->error_info);
}